

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O0

void __thiscall xe::TcpIpLink::stopTestProcess(TcpIpLink *this)

{
  deBool dVar1;
  CommLinkState CVar2;
  Error *this_00;
  BlockBuffer<unsigned_char> *dst;
  bool bVar3;
  TcpIpLink *this_local;
  
  while( true ) {
    dVar1 = deGetFalse();
    bVar3 = false;
    if (dVar1 == 0) {
      CVar2 = TcpIpLinkState::getState(&this->m_state);
      bVar3 = CVar2 != COMMLINKSTATE_ERROR;
    }
    if (!bVar3) break;
    dVar1 = deGetFalse();
    if (dVar1 == 0) {
      dst = TcpIpSendThread::getBuffer(&this->m_sendThread);
      writeStopExecution(dst);
      return;
    }
  }
  this_00 = (Error *)__cxa_allocate_exception(0x10);
  Error::Error(this_00,(char *)0x0,"m_state.getState() != COMMLINKSTATE_ERROR",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
               ,0x22f);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void TcpIpLink::stopTestProcess (void)
{
	XE_CHECK(m_state.getState() != COMMLINKSTATE_ERROR);
	writeStopExecution(m_sendThread.getBuffer());
}